

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.h
# Opt level: O0

void __thiscall Argument::Argument(Argument *this,int argc,char **argv)

{
  double normalpha;
  double percent;
  double eps;
  double feps;
  char *pcVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  unsigned_long_long uVar5;
  float fVar6;
  double dVar7;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  string local_280;
  allocator local_259;
  undefined1 local_258 [8];
  string postfix;
  string local_230 [32];
  stringstream local_210 [8];
  stringstream sstr;
  int local_84;
  undefined1 local_80 [4];
  int ind;
  string value;
  string param;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  char **local_20;
  char **argv_local;
  Argument *pAStack_10;
  int argc_local;
  Argument *this_local;
  
  this->_func = 2;
  this->_seedsize = 0x32;
  this->_samplesize = 1000;
  this->_probEdge = 0.1;
  this->_budget = 5000.0;
  this->_eps = 0.1;
  this->_feps = 0.1;
  this->_delta = -1.0;
  this->_percent = 0.99999;
  this->_budpercent = 0.0001;
  this->_normalpha = 0.2;
  this->_model = IC;
  local_20 = argv;
  argv_local._4_4_ = argc;
  pAStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_graphname,"facebook",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_mode,"g",local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_dir,"graphInfo",&local_36);
  std::allocator<char>::~allocator((allocator<char> *)&local_36);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_resultFolder,"result",&local_37);
  std::allocator<char>::~allocator((allocator<char> *)&local_37);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_algName,"opim-b",&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->_probDist,"load",(allocator *)(param.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(param.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&this->_outFileName);
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  local_84 = 1;
  while ((local_84 < argv_local._4_4_ && (*local_20[local_84] == '-'))) {
    pcVar1 = local_20[local_84];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,pcVar1,(allocator *)(postfix.field_2._M_local_buf + 0xf))
    ;
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_210,local_230,_Var3);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)(postfix.field_2._M_local_buf + 0xf));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_210,(string *)(value.field_2._M_local_buf + 8),'=');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_210,(string *)local_80,'=');
    iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::stoi((string *)local_80,(size_t *)0x0,10);
      this->_func = iVar4;
    }
    else {
      iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::stoi((string *)local_80,(size_t *)0x0,10);
        this->_seedsize = iVar4;
      }
      else {
        iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
        if (iVar4 == 0) {
          uVar5 = std::__cxx11::stoull((string *)local_80,(size_t *)0x0,10);
          this->_samplesize = uVar5;
        }
        else {
          iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
          if (iVar4 == 0) {
            fVar6 = std::__cxx11::stof((string *)local_80,(size_t *)0x0);
            this->_probEdge = fVar6;
          }
          else {
            iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
            if (iVar4 == 0) {
              dVar7 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
              this->_eps = dVar7;
            }
            else {
              iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
              if (iVar4 == 0) {
                dVar7 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
                this->_feps = dVar7;
              }
              else {
                iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                if (iVar4 == 0) {
                  dVar7 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
                  this->_delta = dVar7;
                }
                else {
                  iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                  if (iVar4 == 0) {
                    dVar7 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
                    this->_budget = dVar7;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                    if (iVar4 == 0) {
                      dVar7 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
                      this->_budpercent = dVar7;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                      if (iVar4 == 0) {
                        dVar7 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
                        this->_normalpha = dVar7;
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                        if (iVar4 == 0) {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"LT");
                          this->_model = (uint)bVar2;
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                          if (iVar4 == 0) {
                            std::__cxx11::string::operator=
                                      ((string *)&this->_graphname,(string *)local_80);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                            if (iVar4 == 0) {
                              std::__cxx11::string::operator=
                                        ((string *)&this->_mode,(string *)local_80);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare(value.field_2._M_local_buf + 8);
                              if (iVar4 == 0) {
                                std::__cxx11::string::operator=
                                          ((string *)&this->_dir,(string *)local_80);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare
                                                  (value.field_2._M_local_buf + 8);
                                if (iVar4 == 0) {
                                  std::__cxx11::string::operator=
                                            ((string *)&this->_resultFolder,(string *)local_80);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare
                                                    (value.field_2._M_local_buf + 8);
                                  if (iVar4 == 0) {
                                    std::__cxx11::string::operator=
                                              ((string *)&this->_algName,(string *)local_80);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare
                                                      (value.field_2._M_local_buf + 8);
                                    if (iVar4 == 0) {
                                      std::__cxx11::string::operator=
                                                ((string *)&this->_probDist,(string *)local_80);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::stringstream::~stringstream(local_210);
    local_84 = local_84 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_258,"_minBound",&local_259);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  bVar2 = std::operator==(&this->_mode,"0");
  if ((bVar2) || (bVar2 = std::operator==(&this->_mode,"vanilla"), bVar2)) {
    std::__cxx11::string::operator=((string *)local_258,"_vanilla");
  }
  else {
    bVar2 = std::operator==(&this->_mode,"1");
    if ((bVar2) || (bVar2 = std::operator==(&this->_mode,"last"), bVar2)) {
      std::__cxx11::string::operator=((string *)local_258,"_lastBound");
    }
  }
  bVar2 = std::operator==(&this->_algName,"opim-b");
  if ((((((bVar2) || (bVar2 = std::operator==(&this->_algName,"OPIM-B"), bVar2)) ||
        (bVar2 = std::operator==(&this->_algName,"opim-b-n"), bVar2)) ||
       ((bVar2 = std::operator==(&this->_algName,"OPIM-B-N"), bVar2 ||
        (bVar2 = std::operator==(&this->_algName,"opim-b-fe"), bVar2)))) ||
      ((bVar2 = std::operator==(&this->_algName,"OPIM-B-FE"), bVar2 ||
       ((bVar2 = std::operator==(&this->_algName,"opim-ba"), bVar2 ||
        (bVar2 = std::operator==(&this->_algName,"OPIM-BA"), bVar2)))))) ||
     ((bVar2 = std::operator==(&this->_algName,"opim-b-fa"), bVar2 ||
      ((((bVar2 = std::operator==(&this->_algName,"OPIM-B-FA"), bVar2 ||
         (bVar2 = std::operator==(&this->_algName,"opim-a"), bVar2)) ||
        (bVar2 = std::operator==(&this->_algName,"OPIM-A"), bVar2)) ||
       ((bVar2 = std::operator==(&this->_algName,"opim-a-f"), bVar2 ||
        (bVar2 = std::operator==(&this->_algName,"OPIM-A-F"), bVar2)))))))) {
    std::__cxx11::string::string((string *)&local_2a0,(string *)&this->_graphname);
    std::operator+(&local_2c0,&this->_algName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
    dVar7 = this->_budpercent;
    normalpha = this->_normalpha;
    percent = this->_percent;
    eps = this->_eps;
    feps = this->_feps;
    std::__cxx11::string::string((string *)&local_2e0,(string *)&this->_probDist);
    IOcontroller::get_out_file_name_budget
              (&local_280,&local_2a0,&local_2c0,dVar7,normalpha,percent,eps,feps,&local_2e0,
               this->_probEdge);
    std::__cxx11::string::operator=((string *)&this->_outFileName,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  else {
    std::__cxx11::string::string((string *)&local_320,(string *)&this->_graphname);
    std::operator+(&local_340,&this->_algName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
    iVar4 = this->_seedsize;
    std::__cxx11::string::string((string *)&local_360,(string *)&this->_probDist);
    IOcontroller::get_out_file_name
              (&local_300,&local_320,&local_340,iVar4,&local_360,this->_probEdge);
    std::__cxx11::string::operator=((string *)&this->_outFileName,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if (this->_model == LT) {
    std::operator+(&local_380,"LT_",&this->_outFileName);
    std::__cxx11::string::operator=((string *)&this->_outFileName,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
  }
  bVar2 = std::operator==(&this->_algName,"OPIM");
  if ((bVar2) || (bVar2 = std::operator==(&this->_algName,"opim"), bVar2)) {
    std::__cxx11::to_string(&local_3c0,this->_samplesize);
    std::operator+(&local_3a0,"_s",&local_3c0);
    std::__cxx11::string::operator+=((string *)&this->_outFileName,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return;
}

Assistant:

Argument(int argc, char* argv[])
    {
        std::string param, value;
        for (int ind = 1; ind < argc; ind++)
        {
            if (argv[ind][0] != '-') {
                break;
            }
            std::stringstream sstr(argv[ind]);
            getline(sstr, param, '=');
            getline(sstr, value, '=');
            if (!param.compare("-func")) {
                _func = stoi(value);
            }
            else if (!param.compare("-seedsize")) {
                _seedsize = stoi(value);
            }
            else if (!param.compare("-samplesize")) {
                _samplesize = stoull(value);
            }
            else if (!param.compare("-pedge")) {
                _probEdge = stof(value);
            }
            else if (!param.compare("-eps")) {
                _eps = stod(value);
            }
            else if (!param.compare("-feps")) {
                _feps = stod(value);
            }
            else if (!param.compare("-delta")) {
                _delta = stod(value);
            }
            else if (!param.compare("-budget")) {
                _budget = stod(value);
            }
            else if (!param.compare("-budper")) {
                _budpercent = stod(value);
            }
            else if (!param.compare("-nalpha")) {
                _normalpha = stod(value);
            }
            else if (!param.compare("-model")) {
                _model = value == "LT" ? LT : IC;
            }
            else if (!param.compare("-gname")) {
                _graphname = value;
            }
            else if (!param.compare("-mode")) {
                _mode = value;
            }
            else if (!param.compare("-dir")) {
                _dir = value;
            }
            else if (!param.compare("-outpath")) {
                _resultFolder = value;
            }
            else if (!param.compare("-alg")) {
                _algName = value;
            }
            else if (!param.compare("-pdist")) {
                _probDist = value;
            }
        }
        std::string postfix = "_minBound"; // Default is to use the minimum upper bound among all the rounds
        if (_mode == "0" || _mode == "vanilla") {
            postfix = "_vanilla";
        }
        else if (_mode == "1" || _mode == "last") {
            postfix = "_lastBound";
        }
        if (_algName == "opim-b" || _algName == "OPIM-B" ||
            _algName == "opim-b-n" || _algName == "OPIM-B-N" ||
            _algName == "opim-b-fe" || _algName == "OPIM-B-FE" ||
            _algName == "opim-ba" || _algName == "OPIM-BA" ||
            _algName == "opim-b-fa" || _algName == "OPIM-B-FA" ||
            _algName == "opim-a" || _algName == "OPIM-A" ||
            _algName == "opim-a-f" || _algName == "OPIM-A-F") {
            _outFileName = TIO::get_out_file_name_budget(_graphname, _algName + postfix, _budpercent,
                    _normalpha, _percent, _eps, _feps, _probDist, _probEdge);
        }
        else {
            _outFileName = TIO::get_out_file_name(_graphname, _algName + postfix, _seedsize, _probDist, _probEdge);
        }
        if (_model == LT) {
            _outFileName = "LT_" + _outFileName;
        }
        if (_algName == "OPIM" || _algName == "opim") {
            _outFileName += "_s" + std::to_string(_samplesize);
        }
    }